

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int tlstran_listener_set(void *arg,char *name,void *buf,size_t sz,nni_type t)

{
  nng_stream_listener *local_40;
  tlstran_ep *ep;
  int rv;
  nni_type t_local;
  size_t sz_local;
  void *buf_local;
  char *name_local;
  void *arg_local;
  
  if (arg == (void *)0x0) {
    local_40 = (nng_stream_listener *)0x0;
  }
  else {
    local_40 = *(nng_stream_listener **)((long)arg + 0x60);
  }
  ep._0_4_ = nni_stream_listener_set(local_40,name,buf,sz,t);
  if ((int)ep == 9) {
    ep._0_4_ = nni_setopt(tlstran_ep_options,name,arg,buf,sz,t);
  }
  return (int)ep;
}

Assistant:

static int
tlstran_listener_set(
    void *arg, const char *name, const void *buf, size_t sz, nni_type t)
{
	int         rv;
	tlstran_ep *ep = arg;

	rv = nni_stream_listener_set(
	    ep != NULL ? ep->listener : NULL, name, buf, sz, t);
	if (rv == NNG_ENOTSUP) {
		rv = nni_setopt(tlstran_ep_options, name, ep, buf, sz, t);
	}
	return (rv);
}